

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charMapper.cpp
# Opt level: O2

CharMapper<bool> * gmlc::utilities::numericEndMapper(void)

{
  CharMapper<bool> *in_RDI;
  
  CharMapper<bool>::CharMapper(in_RDI,false);
  (in_RDI->key)._M_elems[0x20] = true;
  (in_RDI->key)._M_elems[9] = true;
  (in_RDI->key)._M_elems[10] = true;
  (in_RDI->key)._M_elems[0xd] = true;
  (in_RDI->key)._M_elems[0] = true;
  (in_RDI->key)._M_elems[0x30] = true;
  (in_RDI->key)._M_elems[0x31] = true;
  (in_RDI->key)._M_elems[0x32] = true;
  (in_RDI->key)._M_elems[0x33] = true;
  (in_RDI->key)._M_elems[0x34] = true;
  (in_RDI->key)._M_elems[0x35] = true;
  (in_RDI->key)._M_elems[0x36] = true;
  (in_RDI->key)._M_elems[0x37] = true;
  (in_RDI->key)._M_elems[0x38] = true;
  (in_RDI->key)._M_elems[0x39] = true;
  return in_RDI;
}

Assistant:

CharMapper<bool> numericEndMapper()
{
    CharMapper<bool> mapper(false);
    mapper.addKey('0', true);
    mapper.addKey('1', true);
    mapper.addKey('2', true);
    mapper.addKey('3', true);
    mapper.addKey('4', true);
    mapper.addKey('5', true);
    mapper.addKey('6', true);
    mapper.addKey('7', true);
    mapper.addKey('8', true);
    mapper.addKey('9', true);
    mapper.addKey(' ', true);
    mapper.addKey('\t', true);
    mapper.addKey('\n', true);
    mapper.addKey('\r', true);
    mapper.addKey('\0', true);
    return mapper;
}